

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void cfd::core::WritePsbtOutput(Serializer *builder,wally_psbt_output *output)

{
  wally_map_item *pwVar1;
  wally_map_item *item_1;
  size_t i_1;
  wally_map_item *item;
  size_t i;
  wally_psbt_output *output_local;
  Serializer *builder_local;
  
  if (output->redeem_script_len != 0) {
    Serializer::AddDirectByte(builder,'\x01');
    Serializer::AddVariableInt(builder,0);
    Serializer::AddVariableBuffer(builder,output->redeem_script,(uint32_t)output->redeem_script_len)
    ;
  }
  if (output->witness_script_len != 0) {
    Serializer::AddDirectByte(builder,'\x01');
    Serializer::AddVariableInt(builder,1);
    Serializer::AddVariableBuffer
              (builder,output->witness_script,(uint32_t)output->witness_script_len);
  }
  for (item = (wally_map_item *)0x0; item < (wally_map_item *)(output->keypaths).num_items;
      item = (wally_map_item *)((long)&item->key + 1)) {
    pwVar1 = (output->keypaths).items + (long)item;
    Serializer::AddPrefixBuffer(builder,2,pwVar1->key,(uint32_t)pwVar1->key_len);
    Serializer::AddVariableBuffer(builder,pwVar1->value,(uint32_t)pwVar1->value_len);
  }
  for (item_1 = (wally_map_item *)0x0; item_1 < (wally_map_item *)(output->unknowns).num_items;
      item_1 = (wally_map_item *)((long)&item_1->key + 1)) {
    pwVar1 = (output->unknowns).items + (long)item_1;
    Serializer::AddVariableBuffer(builder,pwVar1->key,(uint32_t)pwVar1->key_len);
    Serializer::AddVariableBuffer(builder,pwVar1->value,(uint32_t)pwVar1->value_len);
  }
  Serializer::AddDirectByte(builder,'\0');
  return;
}

Assistant:

static void WritePsbtOutput(
    Serializer *builder, const struct wally_psbt_output *output) {
  if (output->redeem_script_len != 0) {
    builder->AddDirectByte(1);
    builder->AddVariableInt(Psbt::kPsbtOutputRedeemScript);
    builder->AddVariableBuffer(
        output->redeem_script,
        static_cast<uint32_t>(output->redeem_script_len));
  }
  if (output->witness_script_len != 0) {
    builder->AddDirectByte(1);
    builder->AddVariableInt(Psbt::kPsbtOutputWitnessScript);
    builder->AddVariableBuffer(
        output->witness_script,
        static_cast<uint32_t>(output->witness_script_len));
  }
  for (size_t i = 0; i < output->keypaths.num_items; ++i) {
    auto *item = &output->keypaths.items[i];
    builder->AddPrefixBuffer(
        Psbt::kPsbtOutputBip32Derivation, item->key,
        static_cast<uint32_t>(item->key_len));
    builder->AddVariableBuffer(
        item->value, static_cast<uint32_t>(item->value_len));
  }
  for (size_t i = 0; i < output->unknowns.num_items; ++i) {
    auto *item = &output->unknowns.items[i];
    builder->AddVariableBuffer(
        item->key, static_cast<uint32_t>(item->key_len));
    builder->AddVariableBuffer(
        item->value, static_cast<uint32_t>(item->value_len));
  }
  builder->AddDirectByte(kPsbtSeparator);
}